

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateReader.cpp
# Opt level: O3

EStatusCode __thiscall StateReader::Start(StateReader *this,string *inStateFilePath)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  IByteReaderWithPosition *inSourceStream;
  PDFDictionary *this_00;
  PDFObject *inOriginal;
  PDFIndirectObjectReference *pPVar3;
  PDFObjectCastPtr<PDFIndirectObjectReference> rootObject;
  string local_50;
  RefCountPtr<PDFIndirectObjectReference> local_30;
  
  EVar1 = InputFile::OpenFile(&this->mInputFile,inStateFilePath);
  if (EVar1 == eSuccess) {
    inSourceStream = InputFile::GetInputStream(&this->mInputFile);
    EVar1 = PDFParser::StartStateFileParsing(&this->mParser,inSourceStream);
    if (EVar1 == eSuccess) {
      this_00 = PDFParser::GetTrailer(&this->mParser);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Root","");
      inOriginal = PDFDictionary::QueryDirectObject(this_00,&local_50);
      pPVar3 = PDFObjectCast<PDFIndirectObjectReference>(inOriginal);
      local_30._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5b00;
      local_30.mValue = pPVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this->mRootObject = pPVar3->mObjectID;
      RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(&local_30);
      return eSuccess;
    }
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,"StateReader::Start, unable to start parsing for the state reader file"
                     );
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,"StateReader::Start, can\'t open file for state reading in %s",
                      (inStateFilePath->_M_dataplus)._M_p);
  }
  return eFailure;
}

Assistant:

EStatusCode StateReader::Start(const std::string& inStateFilePath)
{
	// open the new file...
	if(mInputFile.OpenFile(inStateFilePath) != PDFHummus::eSuccess)
	{
		TRACE_LOG1("StateReader::Start, can't open file for state reading in %s",inStateFilePath.c_str());
		return PDFHummus::eFailure;
	}
	
	if(mParser.StartStateFileParsing(mInputFile.GetInputStream()) != PDFHummus::eSuccess)
	{
		TRACE_LOG("StateReader::Start, unable to start parsing for the state reader file");
		return PDFHummus::eFailure;
	}

	// set the root object
	PDFObjectCastPtr<PDFIndirectObjectReference> rootObject(mParser.GetTrailer()->QueryDirectObject("Root"));
	mRootObject = rootObject->mObjectID;

	return PDFHummus::eSuccess;
}